

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O2

optional<VariableDefinition> * __thiscall
Scope::find(optional<VariableDefinition> *__return_storage_ptr__,Scope *this,string *variableName,
           bool canCrossFunctionBarrier)

{
  bool bVar1;
  Scope *pSVar2;
  byte bVar3;
  undefined1 local_68 [8];
  optional<VariableDefinition> find;
  
  bVar3 = 0;
  find.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
  super__Optional_payload<VariableDefinition,_true,_false,_false>.
  super__Optional_payload_base<VariableDefinition>._24_8_ = variableName;
  do {
    findLocally((optional<VariableDefinition> *)local_68,this,
                (string *)
                find.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
                super__Optional_payload<VariableDefinition,_true,_false,_false>.
                super__Optional_payload_base<VariableDefinition>._24_8_,(bool)(bVar3 & 1));
    if (find.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
        super__Optional_payload<VariableDefinition,_true,_false,_false>.
        super__Optional_payload_base<VariableDefinition>._M_payload._M_value.isFullyBound == true) {
      std::_Optional_base<VariableDefinition,_false,_false>::_Optional_base
                (&__return_storage_ptr__->super__Optional_base<VariableDefinition,_false,_false>,
                 (_Optional_base<VariableDefinition,_false,_false> *)local_68);
LAB_00112587:
      bVar1 = false;
      pSVar2 = this;
    }
    else {
      pSVar2 = (this->outerScope).super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (pSVar2 == (Scope *)0x0) {
        (__return_storage_ptr__->super__Optional_base<VariableDefinition,_false,_false>)._M_payload.
        super__Optional_payload<VariableDefinition,_true,_false,_false>.
        super__Optional_payload_base<VariableDefinition>._M_engaged = false;
        goto LAB_00112587;
      }
      bVar3 = canCrossFunctionBarrier & this->outerScopeCrossesFunctionBarrier | bVar3;
      if (canCrossFunctionBarrier) {
        bVar1 = true;
      }
      else {
        bVar1 = true;
        if ((this->outerScopeCrossesFunctionBarrier & 1U) != 0) {
          (__return_storage_ptr__->super__Optional_base<VariableDefinition,_false,_false>).
          _M_payload.super__Optional_payload<VariableDefinition,_true,_false,_false>.
          super__Optional_payload_base<VariableDefinition>._M_engaged = false;
          bVar3 = 1;
          bVar1 = false;
          pSVar2 = this;
        }
      }
    }
    std::_Optional_payload_base<VariableDefinition>::_M_reset
              ((_Optional_payload_base<VariableDefinition> *)local_68);
    this = pSVar2;
    if (!bVar1) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::optional<VariableDefinition> find(const std::string & variableName, bool canCrossFunctionBarrier) {

    Scope* scopeToSearch = this;

    bool considerPartiallyBound = false;

    while (true) {
      auto find = scopeToSearch->findLocally(variableName, considerPartiallyBound);

      if (find) {
        return find;
      }

      if (scopeToSearch->outerScope != nullptr) {
        if (scopeToSearch->outerScopeCrossesFunctionBarrier) {
          considerPartiallyBound = true;
        }

        if (!canCrossFunctionBarrier && scopeToSearch->outerScopeCrossesFunctionBarrier) {
          return std::nullopt;

        } else {
          scopeToSearch = scopeToSearch->outerScope.get();
        }
      } else {
        return std::nullopt;
      }
    }
  }